

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSet.cpp
# Opt level: O2

void __thiscall
myvk::DescriptorSet::UpdateStorageImage
          (DescriptorSet *this,Ptr<ImageView> *image_view,uint32_t binding,uint32_t array_element)

{
  PFN_vkUpdateDescriptorSets p_Var1;
  int iVar2;
  undefined4 extraout_var;
  VkDescriptorImageInfo info;
  VkWriteDescriptorSet write;
  
  p_Var1 = vkUpdateDescriptorSets;
  write.pImageInfo = &info;
  info.sampler = (VkSampler)0x0;
  info.imageView =
       ((image_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_image_view;
  info.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  info._20_4_ = 0;
  write.pNext = (void *)0x0;
  write.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  write.pTexelBufferView = (VkBufferView *)0x0;
  write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  write._4_4_ = 0;
  write.dstSet = this->m_descriptor_set;
  write.dstArrayElement = array_element;
  write.dstBinding = binding;
  write.descriptorCount = 1;
  write.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
  iVar2 = (*(this->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*p_Var1)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar2) + 0x268),1,&write,0,
            (VkCopyDescriptorSet *)0x0);
  return;
}

Assistant:

void DescriptorSet::UpdateStorageImage(const Ptr<ImageView> &image_view, uint32_t binding,
                                       uint32_t array_element) const {
	VkDescriptorImageInfo info = {};
	info.imageView = image_view->GetHandle();
	info.imageLayout = VK_IMAGE_LAYOUT_GENERAL;

	VkWriteDescriptorSet write = {};
	write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
	write.dstSet = m_descriptor_set;
	write.dstBinding = binding;
	write.dstArrayElement = array_element;
	write.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
	write.descriptorCount = 1;
	write.pImageInfo = &info;

	vkUpdateDescriptorSets(GetDevicePtr()->GetHandle(), 1, &write, 0, nullptr);
}